

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::encryption_handler::switch_recv_crypto
          (encryption_handler *this,shared_ptr<libtorrent::crypto_plugin> *crypto,
          crypto_receive_buffer *recv_buffer)

{
  bool bVar1;
  element_type *peVar2;
  tuple<int_&,_int_&,_int_&> local_90;
  undefined8 local_68;
  undefined8 local_60;
  tuple<int,_int,_int> local_54;
  undefined1 local_48 [8];
  vector<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_> wr_buf;
  int local_28;
  int produce;
  int consume;
  int packet_size;
  crypto_receive_buffer *recv_buffer_local;
  shared_ptr<libtorrent::crypto_plugin> *crypto_local;
  encryption_handler *this_local;
  
  _consume = recv_buffer;
  recv_buffer_local = (crypto_receive_buffer *)crypto;
  crypto_local = (shared_ptr<libtorrent::crypto_plugin> *)this;
  ::std::shared_ptr<libtorrent::crypto_plugin>::operator=(&this->m_dec_handler,crypto);
  produce = 0;
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)crypto);
  if (bVar1) {
    local_28 = 0;
    wr_buf.super__Vector_base<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    ::std::vector<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>::vector
              ((vector<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_> *)local_48)
    ;
    peVar2 = ::std::
             __shared_ptr_access<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)crypto);
    span<libtorrent::span<char>>::
    span<std::vector<libtorrent::span<char>,std::allocator<libtorrent::span<char>>>,libtorrent::span<char>,void>
              ((span<libtorrent::span<char>> *)&local_68,
               (vector<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_> *)local_48)
    ;
    (*peVar2->_vptr_crypto_plugin[5])(&local_54,peVar2,local_68,local_60);
    ::std::tie<int,int,int>
              (&local_90,&stack0xffffffffffffffd8,
               (int *)((long)&wr_buf.
                              super__Vector_base<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),&produce);
    ::std::tuple<int&,int&,int&>::operator=((tuple<int&,int&,int&> *)&local_90,&local_54);
    ::std::vector<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>::~vector
              ((vector<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_> *)local_48)
    ;
  }
  crypto_receive_buffer::crypto_reset(_consume,produce);
  return;
}

Assistant:

void encryption_handler::switch_recv_crypto(std::shared_ptr<crypto_plugin> crypto
		, aux::crypto_receive_buffer& recv_buffer)
	{
		m_dec_handler = crypto;
		int packet_size = 0;
		if (crypto)
		{
			int consume = 0;
			int produce = 0;
			std::vector<span<char>> wr_buf;
			std::tie(consume, produce, packet_size) = crypto->decrypt(wr_buf);
			TORRENT_ASSERT(wr_buf.empty());
			TORRENT_ASSERT(consume == 0);
			TORRENT_ASSERT(produce == 0);
		}
		recv_buffer.crypto_reset(packet_size);
	}